

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool deqp::egl::Image::isDepthFormat(GLenum format)

{
  GLenum format_local;
  
  if (((1 < format - 0x1907) && (format != 0x8051)) && (2 < format - 0x8056)) {
    if (format == 0x81a5) {
      return true;
    }
    if (format == 0x8d48) {
      return false;
    }
    if (format != 0x8d62) {
      return false;
    }
  }
  return false;
}

Assistant:

bool isDepthFormat (GLenum format)
{
	switch (format)
	{
		case GL_RGB:
		case GL_RGB8:
		case GL_RGB565:
		case GL_RGBA:
		case GL_RGBA4:
		case GL_RGBA8:
		case GL_RGB5_A1:
			return false;

		case GL_DEPTH_COMPONENT16:
			return true;

		case GL_STENCIL_INDEX8:
			return false;

		default:
			DE_ASSERT(false);
			return false;
	}
}